

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

ContainsMatcher *
Catch::Matchers::Contains
          (ContainsMatcher *__return_storage_ptr__,string *str,Choice caseSensitivity)

{
  CasedString local_38;
  
  local_38.m_caseSensitivity = caseSensitivity;
  StdString::CasedString::adjustString(&local_38.m_str,&local_38,str);
  StdString::ContainsMatcher::ContainsMatcher(__return_storage_ptr__,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.m_str._M_dataplus._M_p != &local_38.m_str.field_2) {
    operator_delete(local_38.m_str._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

StdString::ContainsMatcher Contains( std::string const& str, CaseSensitive::Choice caseSensitivity ) {
        return StdString::ContainsMatcher( StdString::CasedString( str, caseSensitivity) );
    }